

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typer.hpp
# Opt level: O2

void __thiscall
Utility::TypeRecipient<Electron::CharacterMapper>::typer_reset
          (TypeRecipient<Electron::CharacterMapper> *this,Typer *param_1)

{
  (*(this->super_Delegate).super_KeyActions._vptr_KeyActions[1])();
  std::__uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>::operator=
            ((__uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_> *)
             &this->previous_typer_,
             (__uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_> *)&this->typer_)
  ;
  std::__uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>::reset
            ((__uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_> *)&this->typer_,
             (pointer)0x0);
  return;
}

Assistant:

void typer_reset(Typer *) override {
			clear_all_keys();

			// It's unsafe to deallocate typer right now, since it is the caller, but also it has a small
			// memory footprint and it's desireable not to imply that the subclass need call it any more.
			// So shuffle it off into a siding.
			previous_typer_ = std::move(typer_);
			typer_ = nullptr;
		}